

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  bool bVar1;
  bool *pbVar2;
  _Optional_payload_base<bool> local_2c;
  _Optional_payload_base<bool> local_2a;
  optional<bool> result_1;
  bool *pbStack_28;
  optional<bool> result;
  bool *removed_local;
  string *emsg_local;
  string *file_local;
  
  pbStack_28 = removed;
  local_2a = (_Optional_payload_base<bool>)RemoveRPathELF(file,emsg,removed);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2a);
  if (bVar1) {
    pbVar2 = std::optional<bool>::value((optional<bool> *)&local_2a);
    file_local._7_1_ = (bool)(*pbVar2 & 1);
  }
  else {
    local_2c = (_Optional_payload_base<bool>)RemoveRPathXCOFF(file,emsg,pbStack_28);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2c);
    if (bVar1) {
      pbVar2 = std::optional<bool>::value((optional<bool> *)&local_2c);
      file_local._7_1_ = (bool)(*pbVar2 & 1);
    }
    else {
      file_local._7_1_ = true;
    }
  }
  return file_local._7_1_;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
  if (cm::optional<bool> result = RemoveRPathELF(file, emsg, removed)) {
    return result.value();
  }
  if (cm::optional<bool> result = RemoveRPathXCOFF(file, emsg, removed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  return true;
}